

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Attribute_PDU::Decode(Attribute_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  AttributeRecordSet local_90;
  ushort local_58;
  undefined1 local_55;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Attribute_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x20) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ::clear(&this->m_vAttributeRecordSets);
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_OrigSimAddr).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8ExtPDUType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8ExtProtocolVersion);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32MasterRecType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8ActionCode);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding1);
  KDataStream::operator>>(pKVar2,&this->m_ui16NumAttrRecSets);
  for (local_58 = 0; local_58 < this->m_ui16NumAttrRecSets; local_58 = local_58 + 1) {
    DATA_TYPE::AttributeRecordSet::AttributeRecordSet(&local_90,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
    ::push_back(&this->m_vAttributeRecordSets,&local_90);
    DATA_TYPE::AttributeRecordSet::~AttributeRecordSet(&local_90);
  }
  return;
}

Assistant:

void Attribute_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ATTRIBUTE_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vAttributeRecordSets.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_OrigSimAddr
           >> m_ui32Padding
           >> m_ui16Padding
           >> m_ui8ExtPDUType
           >> m_ui8ExtProtocolVersion
           >> m_ui32MasterRecType
           >> m_ui8ActionCode
           >> m_ui8Padding1
           >> m_ui16NumAttrRecSets;

    for( KUINT16 i = 0; i < m_ui16NumAttrRecSets; ++i )
    {
        m_vAttributeRecordSets.push_back( AttributeRecordSet( stream ) );
    }
}